

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O1

void advance_engine<trng::mrg3s>(mrg3s *r1,mrg3s *r2,long N)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  if (0 < N) {
    do {
      iVar3 = (r1->S).r[0];
      iVar1 = (r1->S).r[1];
      uVar4 = (long)(r1->S).r[2] * (long)(r1->P).a[2] +
              (long)(r1->P).a[1] * (long)iVar1 + (long)(r1->P).a[0] * (long)iVar3;
      uVar4 = (uVar4 >> 0x1f) * -0x7fffadb3 + uVar4;
      (r1->S).r[2] = iVar1;
      uVar4 = (uVar4 >> 0x1f) * -0x7fffadb3 + uVar4;
      iVar1 = (int)uVar4;
      iVar2 = iVar1 + -0x7fffadb3;
      if (uVar4 < 0x7fffadb3) {
        iVar2 = iVar1;
      }
      (r1->S).r[1] = iVar3;
      (r1->S).r[0] = iVar2;
      iVar3 = (r2->S).r[0];
      iVar1 = (r2->S).r[1];
      uVar4 = (long)(r2->S).r[2] * (long)(r2->P).a[2] +
              (long)(r2->P).a[1] * (long)iVar1 + (long)(r2->P).a[0] * (long)iVar3;
      uVar4 = (uVar4 >> 0x1f) * -0x7fffadb3 + uVar4;
      (r2->S).r[2] = iVar1;
      uVar4 = (uVar4 >> 0x1f) * -0x7fffadb3 + uVar4;
      iVar1 = (int)uVar4;
      (r2->S).r[1] = iVar3;
      iVar3 = iVar1 + -0x7fffadb3;
      if (uVar4 < 0x7fffadb3) {
        iVar3 = iVar1;
      }
      (r2->S).r[0] = iVar3;
      N = N + -1;
    } while (N != 0);
  }
  return;
}

Assistant:

void advance_engine(R &r1, R &r2, const long N) {
  for (long i{0}; i < N; ++i) {
    r1();
    r2();
  }
}